

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

uint64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_fixed64
                   (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  bool bVar1;
  uint64_t ret;
  uint64_t default_val;
  upb_MiniTableField field;
  uint64_t local_28;
  uint64_t local_20;
  upb_MiniTableField local_18;
  
  local_20 = 0;
  local_18.number_dont_copy_me__upb_internal_use_only = 8;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x120;
  local_18.presence = 0x47;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\x06';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc2;
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,&local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return local_20;
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,&local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return local_28;
}

Assistant:

UPB_INLINE uint64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_fixed64(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  uint64_t default_val = (uint64_t)0ull;
  uint64_t ret;
  const upb_MiniTableField field = {8, UPB_SIZE(528, 288), 71, kUpb_NoSub, 6, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_8Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}